

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap14_char_var_index
                  (TT_CMap cmap,TT_CMap ucmap,FT_UInt32 charcode,FT_UInt32 variantSelector)

{
  FT_UInt FVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  FT_ULong nondefOff;
  FT_ULong defOff;
  FT_Byte *p;
  FT_UInt32 variantSelector_local;
  FT_UInt32 charcode_local;
  TT_CMap ucmap_local;
  TT_CMap cmap_local;
  
  pbVar2 = tt_cmap14_find_variant(cmap->data + 6,variantSelector);
  if (pbVar2 == (byte *)0x0) {
    cmap_local._4_4_ = 0;
  }
  else {
    uVar3 = (ulong)((uint)*pbVar2 << 0x18 | (uint)pbVar2[1] << 0x10 | (uint)pbVar2[2] << 8 |
                   (uint)pbVar2[3]);
    uVar4 = (ulong)((uint)pbVar2[4] << 0x18 | (uint)pbVar2[5] << 0x10 | (uint)pbVar2[6] << 8 |
                   (uint)pbVar2[7]);
    if ((uVar3 != 0) &&
       (FVar1 = tt_cmap14_char_map_def_binary(cmap->data + uVar3,charcode), FVar1 != 0)) {
      FVar1 = (*((ucmap->cmap).clazz)->char_index)(&ucmap->cmap,charcode);
      return FVar1;
    }
    if (uVar4 == 0) {
      cmap_local._4_4_ = 0;
    }
    else {
      cmap_local._4_4_ = tt_cmap14_char_map_nondef_binary(cmap->data + uVar4,charcode);
    }
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap14_char_var_index( TT_CMap    cmap,
                            TT_CMap    ucmap,
                            FT_UInt32  charcode,
                            FT_UInt32  variantSelector )
  {
    FT_Byte*  p = tt_cmap14_find_variant( cmap->data + 6, variantSelector );
    FT_ULong  defOff;
    FT_ULong  nondefOff;


    if ( !p )
      return 0;

    defOff    = TT_NEXT_ULONG( p );
    nondefOff = TT_PEEK_ULONG( p );

    if ( defOff != 0                                                    &&
         tt_cmap14_char_map_def_binary( cmap->data + defOff, charcode ) )
    {
      /* This is the default variant of this charcode.  GID not stored */
      /* here; stored in the normal Unicode charmap instead.           */
      return ucmap->cmap.clazz->char_index( &ucmap->cmap, charcode );
    }

    if ( nondefOff != 0 )
      return tt_cmap14_char_map_nondef_binary( cmap->data + nondefOff,
                                               charcode );

    return 0;
  }